

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

RuntimeArray * __thiscall
spvtools::opt::InstrumentPass::GetUintXRuntimeArrayType
          (InstrumentPass *this,uint32_t width,RuntimeArray **rarr_ty)

{
  uint32_t id;
  uint32_t uVar1;
  Integer *element;
  RuntimeArray *pRVar2;
  TypeManager *this_00;
  DefUseManager *this_01;
  DecorationManager *this_02;
  
  pRVar2 = *rarr_ty;
  if (pRVar2 == (RuntimeArray *)0x0) {
    element = GetInteger(this,width,false);
    pRVar2 = GetRuntimeArray(this,&element->super_Type);
    *rarr_ty = pRVar2;
    this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
    id = analysis::TypeManager::GetTypeInstruction(this_00,&(*rarr_ty)->super_Type);
    this_01 = Pass::get_def_use_mgr(&this->super_Pass);
    uVar1 = analysis::DefUseManager::NumUses(this_01,id);
    if (uVar1 != 0) {
      __assert_fail("get_def_use_mgr()->NumUses(uint_arr_ty_id) == 0 && \"used RuntimeArray type returned\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                    ,0x1b9,
                    "analysis::RuntimeArray *spvtools::opt::InstrumentPass::GetUintXRuntimeArrayType(uint32_t, analysis::RuntimeArray **)"
                   );
    }
    this_02 = Pass::get_decoration_mgr(&this->super_Pass);
    analysis::DecorationManager::AddDecorationVal(this_02,id,6,width >> 3);
    pRVar2 = *rarr_ty;
  }
  return pRVar2;
}

Assistant:

analysis::RuntimeArray* InstrumentPass::GetUintXRuntimeArrayType(
    uint32_t width, analysis::RuntimeArray** rarr_ty) {
  if (*rarr_ty == nullptr) {
    *rarr_ty = GetRuntimeArray(GetInteger(width, false));
    uint32_t uint_arr_ty_id =
        context()->get_type_mgr()->GetTypeInstruction(*rarr_ty);
    // By the Vulkan spec, a pre-existing RuntimeArray of uint must be part of
    // a block, and will therefore be decorated with an ArrayStride. Therefore
    // the undecorated type returned here will not be pre-existing and can
    // safely be decorated. Since this type is now decorated, it is out of
    // sync with the TypeManager and therefore the TypeManager must be
    // invalidated after this pass.
    assert(get_def_use_mgr()->NumUses(uint_arr_ty_id) == 0 &&
           "used RuntimeArray type returned");
    get_decoration_mgr()->AddDecorationVal(
        uint_arr_ty_id, uint32_t(spv::Decoration::ArrayStride), width / 8u);
  }
  return *rarr_ty;
}